

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

Maybe<kj::Promise<unsigned_long>_> __thiscall
kj::AsyncIoStreamWithGuards::tryPumpFrom
          (AsyncIoStreamWithGuards *this,AsyncInputStream *input,uint64_t amount)

{
  PromiseArenaMember *node;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<unsigned_long>_>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<unsigned_long>_>_2 extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<unsigned_long>_>_2 extraout_RDX_01;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<unsigned_long>_>_2 aVar1;
  Maybe<kj::Promise<unsigned_long>_> MVar2;
  PromiseArenaMember *local_50;
  PromiseBase local_48;
  AsyncInputStream *local_40;
  EventLoop *local_38;
  
  if (*(char *)((long)&input[9]._vptr_AsyncInputStream + 1) == '\x01') {
    (**(code **)(*(long *)amount + 0x18))
              (&stack0xffffffffffffffc0,amount,input[4]._vptr_AsyncInputStream + 1);
    *(undefined1 *)&(this->super_AsyncIoStream).super_AsyncInputStream._vptr_AsyncInputStream = 1;
    (this->super_AsyncIoStream).super_AsyncOutputStream._vptr_AsyncOutputStream =
         (_func_int **)local_40;
    aVar1 = extraout_RDX;
  }
  else {
    kj::_::ForkHub<kj::_::Void>::addBranch((ForkHub<kj::_::Void> *)&stack0xffffffffffffffb0);
    local_40 = input;
    local_38 = (EventLoop *)amount;
    Promise<void>::
    then<kj::AsyncIoStreamWithGuards::tryPumpFrom(kj::AsyncInputStream&,unsigned_long)::_lambda()_1_>
              ((Promise<void> *)&stack0xffffffffffffffb8,
               (anon_class_24_3_e7c12ea1_for_func *)&stack0xffffffffffffffb0);
    node = local_50;
    *(undefined1 *)&(this->super_AsyncIoStream).super_AsyncInputStream._vptr_AsyncInputStream = 1;
    (this->super_AsyncIoStream).super_AsyncOutputStream._vptr_AsyncOutputStream =
         (_func_int **)local_48.node.ptr;
    local_48.node.ptr = (OwnPromiseNode)(PromiseNode *)0x0;
    aVar1 = extraout_RDX_00;
    if (local_50 != (PromiseArenaMember *)0x0) {
      local_50 = (PromiseArenaMember *)0x0;
      kj::_::PromiseDisposer::dispose(node);
      aVar1 = extraout_RDX_01;
    }
  }
  MVar2.ptr.field_1 = aVar1;
  MVar2.ptr._0_8_ = this;
  return (Maybe<kj::Promise<unsigned_long>_>)MVar2.ptr;
}

Assistant:

kj::Maybe<kj::Promise<uint64_t>> tryPumpFrom(AsyncInputStream& input,
                                               uint64_t amount = kj::maxValue) override {
    if (writeGuardReleased) {
      return input.pumpTo(*inner, amount);
    } else {
      return writeGuard.addBranch().then([this,&input,amount]() {
        return input.pumpTo(*inner, amount);
      });
    }
  }